

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int push_all(mg_context *ctx,FILE *fp,SOCKET sock,SSL *ssl,char *buf,int len)

{
  char *__nptr;
  char cVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  uint64_t uVar5;
  ulong uVar6;
  undefined4 in_register_00000014;
  size_t __n;
  stop_flag_t *stop_flag;
  SSL *__buf;
  double dVar7;
  ulong local_60;
  uint64_t local_58;
  pollfd local_48;
  ulong local_40;
  SSL *local_38;
  
  if (ctx == (mg_context *)0x0) {
LAB_001137c0:
    uVar6 = 0xffffffff;
    goto LAB_001137c2;
  }
  __n = (ulong)buf & 0xffffffff;
  __nptr = (ctx->dd).config[0xb];
  local_38 = ssl;
  if (__nptr == (char *)0x0) {
LAB_0011361c:
    dVar7 = strtod("30000",(char **)0x0);
    dVar7 = dVar7 / 1000.0;
  }
  else {
    iVar2 = atoi(__nptr);
    dVar7 = (double)iVar2 / 1000.0;
    if (dVar7 <= 0.0) goto LAB_0011361c;
  }
  stop_flag = &ctx->stop_flag;
  local_40 = (ulong)(dVar7 * 1000000000.0);
  local_40 = (long)(dVar7 * 1000000000.0 - 9.223372036854776e+18) & (long)local_40 >> 0x3f |
             local_40;
  uVar6 = 0;
  while ((0 < (int)__n && (*stop_flag == 0))) {
    if (dVar7 <= 0.0) {
      local_60 = 0;
      local_58 = 0;
    }
    else {
      local_58 = mg_get_current_time_ns();
      local_60 = local_40;
    }
    if (CONCAT44(in_register_00000014,sock) != 0) goto LAB_001137c0;
    __buf = local_38 + uVar6;
LAB_001136e8:
    sVar3 = send((int)fp,__buf,__n,0x4000);
    iVar2 = (int)sVar3;
    if (iVar2 < 0) {
      piVar4 = __errno_location();
      if (((*piVar4 == 4) || (*piVar4 == 0xb)) && (*stop_flag == 0)) goto LAB_00113732;
      goto LAB_001137b4;
    }
    if (*stop_flag != 0) goto LAB_001137b4;
    if (iVar2 == 0) goto LAB_00113732;
    uVar6 = (ulong)(uint)((int)uVar6 + iVar2);
    __n = (size_t)(uint)((int)__n - iVar2);
  }
LAB_001137c2:
  return (int)uVar6;
LAB_00113732:
  local_48.events = 4;
  local_48.fd = (int)fp;
  iVar2 = mg_poll(&local_48,1,200,stop_flag);
  cVar1 = (0 < iVar2) * '\x03';
  if (*stop_flag != 0) {
    cVar1 = '\x01';
  }
  if ((cVar1 != '\x03') &&
     ((cVar1 != '\0' ||
      ((0.0 < dVar7 && (uVar5 = mg_get_current_time_ns(), local_60 < uVar5 - local_58)))))) {
LAB_001137b4:
    if ((int)uVar6 != 0) goto LAB_001137c2;
    goto LAB_001137c0;
  }
  goto LAB_001136e8;
}

Assistant:

static int
push_all(struct mg_context *ctx,
         FILE *fp,
         SOCKET sock,
         SSL *ssl,
         const char *buf,
         int len)
{
	double timeout = -1.0;
	int n, nwritten = 0;

	if (ctx == NULL) {
		return -1;
	}

	if (ctx->dd.config[REQUEST_TIMEOUT]) {
		timeout = atoi(ctx->dd.config[REQUEST_TIMEOUT]) / 1000.0;
	}
	if (timeout <= 0.0) {
		timeout = strtod(config_options[REQUEST_TIMEOUT].default_value, NULL)
		          / 1000.0;
	}

	while ((len > 0) && STOP_FLAG_IS_ZERO(&ctx->stop_flag)) {
		n = push_inner(ctx, fp, sock, ssl, buf + nwritten, len, timeout);
		if (n < 0) {
			if (nwritten == 0) {
				nwritten = -1; /* Propagate the error */
			}
			break;
		} else if (n == 0) {
			break; /* No more data to write */
		} else {
			nwritten += n;
			len -= n;
		}
	}

	return nwritten;
}